

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O1

int mbedtls_md_file(mbedtls_md_info_t *md_info,char *path,uchar *output)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  int iVar3;
  mbedtls_md_context_t ctx;
  uchar buf [1024];
  mbedtls_md_context_t local_448;
  uchar local_428 [1024];
  
  if (md_info == (mbedtls_md_info_t *)0x0) {
    iVar3 = -0x5100;
  }
  else {
    __stream = fopen(path,"rb");
    if (__stream == (FILE *)0x0) {
      iVar3 = -0x5200;
    }
    else {
      local_448.md_info = (mbedtls_md_info_t *)0x0;
      local_448.md_ctx = (void *)0x0;
      local_448.hmac_ctx = (void *)0x0;
      local_448.md_ctx = (*md_info->ctx_alloc_func)();
      if (local_448.md_ctx == (void *)0x0) {
        iVar3 = -0x5180;
      }
      else {
        local_448.md_info = md_info;
        (*md_info->starts_func)(local_448.md_ctx);
        sVar2 = fread(local_428,1,0x400,__stream);
        if (sVar2 != 0) {
          do {
            (*md_info->update_func)(local_448.md_ctx,local_428,sVar2);
            sVar2 = fread(local_428,1,0x400,__stream);
          } while (sVar2 != 0);
        }
        iVar1 = ferror(__stream);
        iVar3 = -0x5200;
        if (iVar1 == 0) {
          (*md_info->finish_func)(local_448.md_ctx,output);
          iVar3 = 0;
        }
      }
      fclose(__stream);
      mbedtls_md_free(&local_448);
    }
  }
  return iVar3;
}

Assistant:

int mbedtls_md_file( const mbedtls_md_info_t *md_info, const char *path, unsigned char *output )
{
    int ret;
    FILE *f;
    size_t n;
    mbedtls_md_context_t ctx;
    unsigned char buf[1024];

    if( md_info == NULL )
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );

    if( ( f = fopen( path, "rb" ) ) == NULL )
        return( MBEDTLS_ERR_MD_FILE_IO_ERROR );

    mbedtls_md_init( &ctx );

    if( ( ret = mbedtls_md_setup( &ctx, md_info, 0 ) ) != 0 )
        goto cleanup;

    md_info->starts_func( ctx.md_ctx );

    while( ( n = fread( buf, 1, sizeof( buf ), f ) ) > 0 )
        md_info->update_func( ctx.md_ctx, buf, n );

    if( ferror( f ) != 0 )
    {
        ret = MBEDTLS_ERR_MD_FILE_IO_ERROR;
        goto cleanup;
    }

    md_info->finish_func( ctx.md_ctx, output );

cleanup:
    fclose( f );
    mbedtls_md_free( &ctx );

    return( ret );
}